

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O3

InterchangeObject * __thiscall
ASDCP::MXF::InterchangeObject::WriteToBuffer(InterchangeObject *this,FrameBuffer *Buffer)

{
  long in_RDX;
  TLVWriter MemWRT;
  TLVWriter TStack_d8;
  Result_t local_90 [104];
  
  if (*(char *)&Buffer[1].m_Data == '\0') {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  else {
    TLVWriter::TLVWriter
              (&TStack_d8,(byte_t *)(*(long *)(in_RDX + 8) + 0x14),*(int *)(in_RDX + 0x10) - 0x14,
               (IPrimerLookup *)Buffer[2]._vptr_FrameBuffer);
    (*Buffer->_vptr_FrameBuffer[0xd])(this,Buffer,&TStack_d8);
    if (-1 < *(int *)&(this->super_KLVPacket)._vptr_KLVPacket) {
      (*Buffer->_vptr_FrameBuffer[8])(local_90,Buffer);
      Kumu::Result_t::operator=((Result_t *)this,local_90);
      Kumu::Result_t::~Result_t(local_90);
      if (-1 < *(int *)&(this->super_KLVPacket)._vptr_KLVPacket) {
        *(int *)(in_RDX + 0x18) = *(int *)(in_RDX + 0x18) + TStack_d8.super_MemIOWriter.m_size;
      }
    }
    std::
    _Rb_tree<ASDCP::TagValue,_std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<ASDCP::TagValue>,_std::allocator<std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>_>_>
    ::~_Rb_tree(&TStack_d8.m_ElementMap._M_t);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::InterchangeObject::WriteToBuffer(ASDCP::FrameBuffer& Buffer)
{
  if ( ! m_UL.HasValue() )
    return RESULT_STATE;

  TLVWriter MemWRT(Buffer.Data() + kl_length, Buffer.Capacity() - kl_length, m_Lookup);
  Result_t result = WriteToTLVSet(MemWRT);

  if ( ASDCP_SUCCESS(result) )
    {
      ui32_t packet_length = MemWRT.Length();
      result = WriteKLToBuffer(Buffer, packet_length);

      if ( ASDCP_SUCCESS(result) )
	Buffer.Size(Buffer.Size() + packet_length);
    }

  return result;
}